

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O0

void __thiscall SoapySDR::ArgInfo::ArgInfo(ArgInfo *this)

{
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI);
  std::__cxx11::string::string(in_RDI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x40);
  std::__cxx11::string::string(in_RDI + 0x60);
  std::__cxx11::string::string(in_RDI + 0x80);
  *(undefined4 *)(in_RDI + 0xa0) = 3;
  Range::Range((Range *)(in_RDI + 0xa8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x15ba48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x15ba58);
  return;
}

Assistant:

SoapySDR::ArgInfo::ArgInfo(void):
    type(SoapySDR::ArgInfo::Type::STRING)
{
    return;
}